

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<CustomUintFormatter<6,false>>::
Ser<SizeComputer,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (VectorFormatter<CustomUintFormatter<6,false>> *this,SizeComputer *s,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  const_iterator __end0;
  const_iterator __begin0;
  unsigned_long *puVar4;
  long in_FS_OFFSET;
  CustomUintFormatter<6,_false> formatter;
  CustomUintFormatter<6,false> local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar2 = (long)puVar1 - (long)puVar4 >> 3;
  lVar3 = 1;
  if ((0xfc < uVar2) && (lVar3 = 3, 0xffff < uVar2)) {
    lVar3 = (ulong)(uVar2 >> 0x20 != 0) * 4 + 5;
  }
  s->nSize = s->nSize + lVar3;
  if (puVar4 != puVar1) {
    do {
      CustomUintFormatter<6,false>::Ser<SizeComputer,unsigned_long>(&local_29,s,*puVar4);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }